

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O0

istream * FIX::operator>>(istream *stream,SessionID *sessionID)

{
  undefined1 local_38 [8];
  string str;
  SessionID *sessionID_local;
  istream *stream_local;
  
  str.field_2._8_8_ = sessionID;
  std::__cxx11::string::string((string *)local_38);
  std::operator>>(stream,(string *)local_38);
  SessionID::fromString((SessionID *)str.field_2._8_8_,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return stream;
}

Assistant:

inline std::istream &operator>>(std::istream &stream, SessionID &sessionID) {
  std::string str;
  stream >> str;
  sessionID.fromString(str);
  return stream;
}